

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_4fPoint::MaximumCoordinate(ON_4fPoint *this)

{
  double dVar1;
  double local_18;
  double c;
  ON_4fPoint *this_local;
  
  dVar1 = std::fabs((double)(ulong)(uint)this->x);
  local_18 = (double)SUB84(dVar1,0);
  dVar1 = std::fabs((double)(ulong)(uint)this->y);
  if (local_18 < (double)SUB84(dVar1,0)) {
    dVar1 = std::fabs((double)(ulong)(uint)this->y);
    local_18 = (double)SUB84(dVar1,0);
  }
  dVar1 = std::fabs((double)(ulong)(uint)this->z);
  if (local_18 < (double)SUB84(dVar1,0)) {
    dVar1 = std::fabs((double)(ulong)(uint)this->z);
    local_18 = (double)SUB84(dVar1,0);
  }
  dVar1 = std::fabs((double)(ulong)(uint)this->w);
  if (local_18 < (double)SUB84(dVar1,0)) {
    dVar1 = std::fabs((double)(ulong)(uint)this->w);
    local_18 = (double)SUB84(dVar1,0);
  }
  return local_18;
}

Assistant:

double ON_4fPoint::MaximumCoordinate() const
{
  double c = fabs(x); if (fabs(y)>c) c=fabs(y); if (fabs(z)>c) c=fabs(z); if (fabs(w)>c) c=fabs(w);
  return c;
}